

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_marker(stbi__jpeg *z,int m)

{
  stbi__context *psVar1;
  byte bVar2;
  byte bVar3;
  stbi_uc sVar4;
  stbi_uc sVar5;
  sbyte sVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int ok;
  long lVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  int i_1;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  int sizes [16];
  uint local_78 [18];
  
  if (m < 0xdd) {
    if (m == 0xc4) {
      psVar1 = z->s;
      bVar2 = stbi__get8(psVar1);
      bVar3 = stbi__get8(psVar1);
      iVar16 = (uint)bVar2 * 0x100 + (uint)bVar3 + -2;
      do {
        if (iVar16 < 1) goto LAB_0010bf92;
        bVar2 = stbi__get8(z->s);
        uVar10 = 0;
        if ((bVar2 & 0xf) < 4 && bVar2 < 0x20) {
          lVar14 = 0;
          do {
            bVar3 = stbi__get8(z->s);
            local_78[lVar14] = (uint)bVar3;
            uVar8 = (int)uVar10 + (uint)bVar3;
            uVar10 = (ulong)uVar8;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x10);
          iVar16 = iVar16 + -0x11;
          uVar17 = (ulong)bVar2 & 0xf;
          if (bVar2 < 0x10) {
            iVar9 = stbi__build_huffman(z->huff_dc + uVar17,(int *)local_78);
            lVar14 = 8;
          }
          else {
            iVar9 = stbi__build_huffman(z->huff_ac + uVar17,(int *)local_78);
            lVar14 = 0x1a48;
          }
          if (iVar9 == 0) {
            uVar10 = 0;
          }
          else {
            if (uVar8 != 0) {
              uVar15 = 0;
              do {
                sVar4 = stbi__get8(z->s);
                z->huff_dc[uVar17].values[uVar15 + lVar14 + -8] = sVar4;
                uVar15 = uVar15 + 1;
              } while (uVar10 != uVar15);
            }
            if (0xf < bVar2) {
              lVar14 = (ulong)(uint)((int)uVar17 << 10) + 0x3688;
              lVar11 = 0;
              do {
                uVar10 = (ulong)z->huff_ac[uVar17].fast[lVar11];
                *(undefined2 *)((long)z->fast_ac[0] + lVar11 * 2 + lVar14 + -0x3688) = 0;
                if (uVar10 != 0xff) {
                  bVar2 = z->huff_ac[uVar17].values[uVar10];
                  if ((bVar2 & 0xf) != 0) {
                    bVar3 = z->huff_ac[uVar17].size[uVar10];
                    uVar7 = (bVar2 & 0xf) + (ushort)bVar3;
                    if (uVar7 < 10) {
                      uVar13 = (int)lVar11 << (bVar3 & 0x1f) & 0x1ff;
                      sVar6 = (sbyte)(bVar2 & 0xf);
                      uVar12 = -1 << sVar6 | 1;
                      if (0xff < uVar13) {
                        uVar12 = 0;
                      }
                      iVar9 = uVar12 + (uVar13 >> (9U - sVar6 & 0x1f));
                      if ((char)iVar9 == iVar9) {
                        *(ushort *)((long)z->fast_ac[0] + lVar11 * 2 + lVar14 + -0x3688) =
                             (short)iVar9 * 0x100 | bVar2 & 0xfff0 | uVar7;
                      }
                    }
                  }
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 != 0x200);
            }
            iVar16 = iVar16 - uVar8;
            uVar10 = 1;
          }
        }
      } while ((char)uVar10 != '\0');
    }
    else if (m == 0xdb) {
      psVar1 = z->s;
      bVar2 = stbi__get8(psVar1);
      bVar3 = stbi__get8(psVar1);
      iVar16 = (uint)bVar3 + (uint)bVar2 * 0x100 + -2;
      do {
        if (iVar16 < 1) goto LAB_0010bf92;
        bVar2 = stbi__get8(z->s);
        uVar8 = bVar2 & 0xf;
        bVar18 = (bVar2 & 0xf0) == 0x10;
        if (uVar8 < 4 && (bVar18 || bVar2 < 0x10)) {
          lVar14 = 0;
          do {
            psVar1 = z->s;
            bVar3 = stbi__get8(psVar1);
            uVar7 = (ushort)bVar3;
            if (0xf < bVar2) {
              sVar4 = stbi__get8(psVar1);
              uVar7 = CONCAT11(bVar3,sVar4);
            }
            *(ushort *)((long)z->dequant[0] + (ulong)""[lVar14] * 2 + (ulong)(uVar8 << 7)) = uVar7;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x40);
          iVar16 = iVar16 + (uint)(bVar2 < 0x10) * 0x40 + -0x81;
        }
      } while (uVar8 < 4 && (bVar18 || bVar2 < 0x10));
    }
    else {
LAB_0010bcec:
      if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
        psVar1 = z->s;
        sVar4 = stbi__get8(psVar1);
        sVar5 = stbi__get8(psVar1);
        uVar8 = (uint)CONCAT11(sVar4,sVar5);
        if (1 < uVar8) {
          if ((m == 0xe0) && (6 < uVar8)) {
            bVar18 = true;
            lVar14 = 0;
            do {
              sVar4 = stbi__get8(z->s);
              if (sVar4 != "JFIF"[lVar14]) {
                bVar18 = false;
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 != 5);
            iVar16 = uVar8 - 7;
            if (bVar18) {
              z->jfif = 1;
            }
          }
          else {
            iVar16 = uVar8 - 2;
            if ((m == 0xee) && (0xd < uVar8)) {
              bVar18 = true;
              lVar14 = 0;
              do {
                sVar4 = stbi__get8(z->s);
                if (sVar4 != "Adobe"[lVar14]) {
                  bVar18 = false;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 6);
              if (bVar18) {
                stbi__get8(z->s);
                stbi__get16be(z->s);
                stbi__get16be(z->s);
                bVar2 = stbi__get8(z->s);
                z->app14_color_transform = (uint)bVar2;
                iVar16 = uVar8 - 0xe;
              }
              else {
                iVar16 = uVar8 - 8;
              }
            }
          }
          stbi__skip(z->s,iVar16);
          goto LAB_0010c01a;
        }
      }
    }
  }
  else if (m != 0xff) {
    if (m != 0xdd) goto LAB_0010bcec;
    psVar1 = z->s;
    sVar4 = stbi__get8(psVar1);
    sVar5 = stbi__get8(psVar1);
    if (CONCAT11(sVar4,sVar5) == 4) {
      psVar1 = z->s;
      sVar4 = stbi__get8(psVar1);
      sVar5 = stbi__get8(psVar1);
      z->restart_interval = (uint)CONCAT11(sVar4,sVar5);
LAB_0010c01a:
      bVar18 = true;
      goto LAB_0010c01c;
    }
  }
  bVar18 = false;
LAB_0010c01c:
  return (int)bVar18;
LAB_0010bf92:
  bVar18 = iVar16 == 0;
  goto LAB_0010c01c;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = (stbi__uint16)(sixteen ? stbi__get16be(z->s) : stbi__get8(z->s));
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}